

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O3

ssize_t sf_parse_params(uint8_t *begin,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  ssize_t sVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar2 = begin;
  pbVar6 = begin;
  if (begin != end) {
    do {
      pbVar2 = pbVar6;
      pbVar6 = pbVar2;
      if (*pbVar2 != 0x3b) break;
      do {
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == end) {
          return -1;
        }
        bVar1 = *pbVar6;
        pbVar2 = pbVar2 + 1;
      } while (bVar1 == 0x20);
      if (bVar1 != 0x2a && 0x19 < (byte)(bVar1 + 0x9f)) {
        return -1;
      }
      pbVar4 = pbVar6;
      do {
        pbVar5 = pbVar4;
        if (SF_KEY_CHARS[*pbVar4] == 0) break;
        pbVar4 = pbVar4 + 1;
        pbVar5 = pbVar6 + ((long)end - (long)pbVar2);
      } while (pbVar4 != end);
      if ((long)pbVar5 - (long)pbVar2 < 0) {
        return -1;
      }
      pbVar6 = pbVar6 + ((long)pbVar5 - (long)pbVar2);
      if ((pbVar5 != end) && (*pbVar6 == 0x3d)) {
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == end) {
          return -1;
        }
        sVar3 = sf_parse_bare_item((nghttp2_sf_value *)0x0,pbVar6,end);
        if (sVar3 < 0) {
          return -1;
        }
        pbVar6 = pbVar6 + sVar3;
      }
      pbVar2 = end;
    } while (pbVar6 != end);
  }
  return (long)pbVar2 - (long)begin;
}

Assistant:

static ssize_t sf_parse_params(const uint8_t *begin, const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  for (; p != end && *p == ';';) {
    ++p;

    sf_discard_sp_end_err(p, end, -1);

    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
    } else if (++p == end) {
      return -1;
    } else {
      slen = sf_parse_bare_item(NULL, p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;
    }
  }

  return p - begin;
}